

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_socket::udp_socket(udp_socket *this,io_context *ios,listen_socket_handle *ls)

{
  pointer __p;
  listen_socket_handle *ls_local;
  io_context *ios_local;
  udp_socket *this_local;
  
  noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::noexcept_move_only<boost::asio::io_context>
            ((noexcept_move_only<boost::asio::basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)this,ios,(type *)0x0);
  this->m_ioc = ios;
  __p = (pointer)operator_new(0x5dc);
  memset(__p,0,0x5dc);
  ::std::unique_ptr<std::array<char,1500ul>,std::default_delete<std::array<char,1500ul>>>::
  unique_ptr<std::default_delete<std::array<char,1500ul>>,void>
            ((unique_ptr<std::array<char,1500ul>,std::default_delete<std::array<char,1500ul>>> *)
             &this->m_buf,__p);
  listen_socket_handle::listen_socket_handle(&this->m_listen_socket,ls);
  this->m_bind_port = 0;
  proxy_settings::proxy_settings(&this->m_proxy_settings);
  ::std::shared_ptr<libtorrent::aux::socks5>::shared_ptr(&this->m_socks5_connection);
  this->field_0xf0 = this->field_0xf0 & 0xfe | 1;
  return;
}

Assistant:

udp_socket::udp_socket(io_context& ios, aux::listen_socket_handle ls)
	: m_socket(ios)
	, m_ioc(ios)
	, m_buf(new receive_buffer())
	, m_listen_socket(std::move(ls))
	, m_bind_port(0)
	, m_abort(true)
{}